

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextboundaryfinder.cpp
# Opt level: O3

void __thiscall
QTextBoundaryFinder::QTextBoundaryFinder
          (QTextBoundaryFinder *this,BoundaryType type,QStringView string,uchar *buffer,
          qsizetype bufferSize)

{
  uint uVar1;
  QCharAttributes *pQVar2;
  long lVar3;
  
  lVar3 = string.m_size;
  this->t = type;
  (this->s).d.d = (Data *)0x0;
  (this->s).d.ptr = (char16_t *)0x0;
  (this->s).d.size = 0;
  (this->sv).m_size = lVar3;
  (this->sv).m_data = string.m_data;
  this->pos = 0;
  uVar1 = *(uint *)&this->field_0x38;
  *(uint *)&this->field_0x38 = uVar1 | 1;
  this->attributes = (QCharAttributes *)0x0;
  if (lVar3 != 0) {
    if (lVar3 < bufferSize && buffer != (uchar *)0x0) {
      this->attributes = (QCharAttributes *)buffer;
      *(uint *)&this->field_0x38 = uVar1 & 0xfffffffe;
    }
    else {
      pQVar2 = (QCharAttributes *)malloc(lVar3 + 1);
      this->attributes = pQVar2;
      if (pQVar2 == (QCharAttributes *)0x0) {
        qBadAlloc();
      }
    }
    init((EVP_PKEY_CTX *)(ulong)type);
  }
  return;
}

Assistant:

QTextBoundaryFinder::QTextBoundaryFinder(BoundaryType type, QStringView string, unsigned char *buffer, qsizetype bufferSize)
    : t(type)
    , sv(string)
    , freeBuffer(true)
{
    if (!sv.isEmpty()) {
        if (buffer && bufferSize / int(sizeof(QCharAttributes)) >= sv.size() + 1) {
            attributes = reinterpret_cast<QCharAttributes *>(buffer);
            freeBuffer = false;
        } else {
            attributes = (QCharAttributes *) malloc((sv.size() + 1) * sizeof(QCharAttributes));
            Q_CHECK_PTR(attributes);
        }
        init(t, sv, attributes);
    }
}